

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O3

bool Function_Template::form1_Shift(ShiftForm1 Shift)

{
  uint8_t value;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 in_XMM2_Qb;
  Image output;
  Image input;
  ImageTemplate<unsigned_char> local_78;
  Image local_50;
  
  value = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_78,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&local_50,value,0,0,&local_78);
  local_78._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_78);
  uVar5 = local_50._width >> 2;
  iVar2 = rand();
  iVar3 = rand();
  uVar6 = local_50._height >> 2;
  auVar7._0_8_ = (double)(iVar3 % 100);
  auVar7._8_8_ = in_XMM2_Qb;
  auVar7 = vfmadd132sd_fma(auVar7,ZEXT816(0) << 0x40,ZEXT816(0x3f847ae147ae147b));
  iVar3 = rand();
  iVar4 = rand();
  auVar8._0_8_ = (double)(iVar4 % 100);
  auVar8._8_8_ = in_XMM2_Qb;
  auVar8 = vfmadd132sd_fma(auVar8,ZEXT816(0) << 0x40,ZEXT816(0x3f847ae147ae147b));
  (*Shift)(&local_78,&local_50,
           auVar7._0_8_ + ((double)(iVar2 % (int)(uVar5 * 2 + (uint)(uVar5 == 0))) - (double)uVar5),
           auVar8._0_8_ + ((double)(iVar3 % (int)(uVar6 * 2 + (uint)(uVar6 == 0))) - (double)uVar6))
  ;
  bVar1 = Unit_Test::verifyImage(&local_78,value);
  local_78._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_78);
  local_50._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_50);
  return bVar1;
}

Assistant:

bool form1_Shift(ShiftForm1 Shift)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image input = uniformImage( intensity );

        const double shiftX = randomFloatValue<double>( -static_cast<double>( input.width()  / 4 ), input.width() / 4 , 1 ) + randomFloatValue<double>( 0, 1, 0.01 );
        const double shiftY = randomFloatValue<double>( -static_cast<double>( input.height() / 4 ), input.height() / 4, 1 ) + randomFloatValue<double>( 0, 1, 0.01 );

        const PenguinV_Image::Image output = Shift( input, shiftX, shiftY );

        return verifyImage( output, intensity );
    }